

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclableObjectWalker::Get
          (RecyclableObjectWalker *this,int index,ResolvedObject *pResolvedObject)

{
  Type pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Type *ppIVar8;
  Type *ppDVar9;
  PropertyRecord *pPVar10;
  ArenaAllocator *alloc;
  RecyclableObjectAddress *this_00;
  RecyclableObject *this_01;
  int iVar11;
  LPCSTR message;
  LPCSTR error;
  Type TVar12;
  uint lineNumber;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  RecyclableArrayWalker *pRVar13;
  int index_00;
  Var aValue;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x8ea,"(pResolvedObject)",
                                "Bad usage of RecyclableObjectWalker::Get");
    if (!bVar3) goto LAB_007ec363;
    *puVar7 = 0;
  }
  iVar4 = 0;
  iVar5 = 0;
  if (this->fakeGroupObjectWalkerList !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    iVar5 = (this->fakeGroupObjectWalkerList->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  }
  if (this->innerArrayObjectWalker != (RecyclableArrayWalker *)0x0) {
    iVar4 = (*(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
              super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase[1])();
  }
  if (((-1 < index) &&
      (this->pMembersList !=
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0)) &&
     (index < iVar5 + iVar4 +
              (this->pMembersList->
              super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).count)) {
    bVar3 = VarIs<Js::RecyclableObject>(this->instance);
    iVar11 = 0;
    if (bVar3) {
      iVar11 = (this->pMembersList->
               super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
               ).count;
    }
    index_00 = index - iVar5;
    if (index < iVar5) {
      this_02 = this->fakeGroupObjectWalkerList;
      if (this_02 ==
          (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x8f9,"(fakeGroupObjectWalkerList)","fakeGroupObjectWalkerList"
                                   );
        if (!bVar3) goto LAB_007ec363;
        *puVar7 = 0;
        this_02 = this->fakeGroupObjectWalkerList;
      }
      ppIVar8 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar5 = (*(*ppIVar8)->_vptr_IDiagObjectModelWalkerBase[2])(*ppIVar8,pResolvedObject);
      return iVar5;
    }
    if (index_00 < iVar11) {
      bVar3 = VarIs<Js::RecyclableObject>(this->instance);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x901,"(Js::VarIs<Js::RecyclableObject>(instance))",
                                    "Js::VarIs<Js::RecyclableObject>(instance)");
        if (!bVar3) goto LAB_007ec363;
        *puVar7 = 0;
      }
      ppDVar9 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pMembersList,index_00);
      iVar5 = (*ppDVar9)->propId;
      pResolvedObject->propId = iVar5;
      if (iVar5 - 0x10U < 0xffffffef) {
        ppDVar9 = JsUtil::
                  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->pMembersList,index_00);
        pDVar1 = *ppDVar9;
        pPVar10 = ScriptContext::GetPropertyName(this->scriptContext,pResolvedObject->propId);
        pResolvedObject->name = (LPCWSTR)(pPVar10 + 1);
        aValue = pDVar1->aVar;
        pResolvedObject->obj = aValue;
        if (aValue == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x910,"(pResolvedObject->obj)","pResolvedObject->obj");
          if (!bVar3) goto LAB_007ec363;
          *puVar7 = 0;
          aValue = pResolvedObject->obj;
          pResolvedObject->scriptContext = this->scriptContext;
          if (aValue == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar3) goto LAB_007ec363;
            *puVar7 = 0;
            aValue = (Var)0x0;
          }
        }
        else {
          pResolvedObject->scriptContext = this->scriptContext;
        }
        bVar3 = TaggedInt::Is(aValue);
        if (bVar3) {
          TVar12 = TypeIds_FirstNumberType;
LAB_007ec22b:
          pResolvedObject->typeId = TVar12;
          alloc = GetArenaFromContext(this->scriptContext);
          this_00 = (RecyclableObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
          RecyclableObjectAddress::RecyclableObjectAddress
                    (this_00,this->instance,pResolvedObject->propId,pResolvedObject->obj,
                     pDVar1->flags >> 1 & 1);
          pResolvedObject->address = (IDiagObjectAddress *)this_00;
          pResolvedObject->isConst = (bool)((byte)pDVar1->flags & 1);
          return 1;
        }
        if ((ulong)aValue >> 0x32 != 0) {
          TVar12 = TypeIds_Number;
          goto LAB_007ec22b;
        }
        this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (this_01 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_007ec363;
          *puVar7 = 0;
        }
        TVar12 = ((this_01->type).ptr)->typeId;
        if (((int)TVar12 < 0x58) || (BVar6 = RecyclableObject::IsExternal(this_01), BVar6 != 0))
        goto LAB_007ec22b;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (bVar3) {
          *puVar7 = 0;
          goto LAB_007ec22b;
        }
        goto LAB_007ec363;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      error = "(0)";
      message = "FALSE";
      lineNumber = 0x907;
    }
    else {
      if (index_00 - iVar11 < iVar4) {
        pRVar13 = this->innerArrayObjectWalker;
        if (pRVar13 == (RecyclableArrayWalker *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x925,"(innerArrayObjectWalker)","innerArrayObjectWalker");
          if (!bVar3) goto LAB_007ec363;
          *puVar7 = 0;
          pRVar13 = this->innerArrayObjectWalker;
        }
        iVar5 = (**(pRVar13->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
                   _vptr_IDiagObjectModelWalkerBase)
                          (pRVar13,(ulong)(uint)(index_00 - iVar11),pResolvedObject);
        return iVar5;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      error = "(false)";
      message = "false";
      lineNumber = 0x929;
    }
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,lineNumber,error,message);
    if (!bVar3) {
LAB_007ec363:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return 0;
}

Assistant:

BOOL RecyclableObjectWalker::Get(int index, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableObjectWalker::Get");

        int fakeObjCount = fakeGroupObjectWalkerList ? fakeGroupObjectWalkerList->Count() : 0;
        int arrayItemCount = innerArrayObjectWalker ? innerArrayObjectWalker->GetChildrenCount() : 0;

        if (index < 0 || !pMembersList || index >= (pMembersList->Count() + arrayItemCount + fakeObjCount))
        {
            return FALSE;
        }

        int nonArrayElementCount = Js::VarIs<Js::RecyclableObject>(instance) ? pMembersList->Count() : 0;

        // First the virtual groups
        if (index < fakeObjCount)
        {
            Assert(fakeGroupObjectWalkerList);
            return fakeGroupObjectWalkerList->Item(index)->GetGroupObject(pResolvedObject);
        }

        index -= fakeObjCount;

        if (index < nonArrayElementCount)
        {
            Assert(Js::VarIs<Js::RecyclableObject>(instance));

            pResolvedObject->propId = pMembersList->Item(index)->propId;

            if (pResolvedObject->propId == Js::Constants::NoProperty || Js::IsInternalPropertyId(pResolvedObject->propId))
            {
                Assert(FALSE);
                return FALSE;
            }

            Js::DebuggerPropertyDisplayInfo* displayInfo = pMembersList->Item(index);
            const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(pResolvedObject->propId);

            pResolvedObject->name = propertyRecord->GetBuffer();
            pResolvedObject->obj = displayInfo->aVar;
            Assert(pResolvedObject->obj);

            pResolvedObject->scriptContext = scriptContext;
            pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                RecyclableObjectAddress,
                instance,
                pResolvedObject->propId,
                pResolvedObject->obj,
                displayInfo->IsInDeadZone() ? TRUE : FALSE);

            pResolvedObject->isConst = displayInfo->IsConst();

            return TRUE;
        }

        index -= nonArrayElementCount;

        if (index < arrayItemCount)
        {
            Assert(innerArrayObjectWalker);
            return innerArrayObjectWalker->Get(index, pResolvedObject);
        }

        Assert(false);
        return FALSE;
    }